

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.c
# Opt level: O0

void unpack_2d_output(float *col_fft,float *output,int n)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  float local_6c;
  float local_64;
  float local_60;
  float local_58;
  float local_50;
  float local_4c;
  bool local_31;
  int x_extra;
  int x2;
  int x;
  int y_extra;
  int y2;
  int y;
  int n_local;
  float *output_local;
  float *col_fft_local;
  
  for (y = 0; y <= n / 2; y = y + 1) {
    iVar5 = y + n / 2;
    bVar3 = n / 2 < iVar5;
    bVar1 = iVar5 < n;
    local_31 = bVar3 && bVar1;
    for (x = 0; x <= n / 2; x = x + 1) {
      iVar6 = x + n / 2;
      bVar4 = iVar6 <= n / 2;
      bVar2 = n <= iVar6;
      if ((bVar4 || bVar2) || (!bVar3 || !bVar1)) {
        local_4c = 0.0;
      }
      else {
        local_4c = col_fft[iVar5 * n + iVar6];
      }
      output[(y * n + x) * 2] = col_fft[y * n + x] - local_4c;
      if (bVar3 && bVar1) {
        local_50 = col_fft[iVar5 * n + x];
      }
      else {
        local_50 = 0.0;
      }
      if (bVar4 || bVar2) {
        local_58 = 0.0;
      }
      else {
        local_58 = col_fft[y * n + iVar6];
      }
      output[(y * n + x) * 2 + 1] = local_50 + local_58;
      if (local_31) {
        if ((bVar4 || bVar2) || (!bVar3 || !bVar1)) {
          local_60 = 0.0;
        }
        else {
          local_60 = col_fft[iVar5 * n + iVar6];
        }
        output[((n - y) * n + x) * 2] = col_fft[y * n + x] + local_60;
        if (bVar3 && bVar1) {
          local_64 = col_fft[iVar5 * n + x];
        }
        else {
          local_64 = 0.0;
        }
        if (bVar4 || bVar2) {
          local_6c = 0.0;
        }
        else {
          local_6c = col_fft[y * n + iVar6];
        }
        output[((n - y) * n + x) * 2 + 1] = -local_64 + local_6c;
      }
    }
  }
  return;
}

Assistant:

static inline void unpack_2d_output(const float *col_fft, float *output,
                                    int n) {
  for (int y = 0; y <= n / 2; ++y) {
    const int y2 = y + n / 2;
    const int y_extra = y2 > n / 2 && y2 < n;

    for (int x = 0; x <= n / 2; ++x) {
      const int x2 = x + n / 2;
      const int x_extra = x2 > n / 2 && x2 < n;
      output[2 * (y * n + x)] =
          col_fft[y * n + x] - (x_extra && y_extra ? col_fft[y2 * n + x2] : 0);
      output[2 * (y * n + x) + 1] = (y_extra ? col_fft[y2 * n + x] : 0) +
                                    (x_extra ? col_fft[y * n + x2] : 0);
      if (y_extra) {
        output[2 * ((n - y) * n + x)] =
            col_fft[y * n + x] +
            (x_extra && y_extra ? col_fft[y2 * n + x2] : 0);
        output[2 * ((n - y) * n + x) + 1] =
            -(y_extra ? col_fft[y2 * n + x] : 0) +
            (x_extra ? col_fft[y * n + x2] : 0);
      }
    }
  }
}